

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurveTerminator::~IfcDimensionCurveTerminator
          (IfcDimensionCurveTerminator *this)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  void *pvVar4;
  
  lVar3 = *(long *)(*(long *)&(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
                              super_IfcAnnotationOccurrence.super_IfcStyledItem + -0x18);
  puVar1 = (undefined8 *)
           (&(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
             super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x0 + lVar3);
  plVar2 = (long *)(&this->field_0xc8 + lVar3);
  plVar2[-0x19] = 0x881038;
  plVar2[2] = 0x881128;
  plVar2[-0x17] = 0x881060;
  plVar2[-0xb] = 0x881088;
  plVar2[-9] = 0x8810b0;
  plVar2[-7] = 0x8810d8;
  plVar2[-4] = 0x881100;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  *puVar1 = 0x8814e0;
  puVar1[0x1b] = 0x881530;
  puVar1[2] = 0x881508;
  if ((long *)puVar1[9] != puVar1 + 0xb) {
    operator_delete((long *)puVar1[9],puVar1[0xb] + 1);
  }
  pvVar4 = (void *)puVar1[6];
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,puVar1[8] - (long)pvVar4);
  }
  operator_delete(puVar1,0xf0);
  return;
}

Assistant:

IfcDimensionCurveTerminator() : Object("IfcDimensionCurveTerminator") {}